

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall haVoc::Moveorder::next_phase(Moveorder *this)

{
  bool bVar1;
  element_type *peVar2;
  Score local_18 [2];
  Moveorder *local_10;
  Moveorder *this_local;
  
  if (((((this->m_phase == HashMove) || (this->m_phase == MateKiller1)) ||
       (this->m_phase == MateKiller2)) || ((this->m_phase == Killer1 || (this->m_phase == Killer2)))
      ) || ((this->m_phase == InitCaptures || (this->m_phase == InitQuiets)))) {
    this->m_phase = this->m_phase + MateKiller1;
  }
  else {
    local_10 = this;
    if ((this->m_phase == GoodCaptures) || (this->m_phase == BadCaptures)) {
      peVar2 = std::
               __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_captures);
      bVar1 = ScoredMoves::end(peVar2);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_captures);
        local_18[1] = 0xffffd8f0;
        ScoredMoves::create_chunk(peVar2,local_18 + 1);
        this->m_phase = this->m_phase + MateKiller1;
        return;
      }
    }
    if ((this->m_phase == GoodQuiets) || (this->m_phase == BadQuiets)) {
      peVar2 = std::
               __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_quiets);
      bVar1 = ScoredMoves::end(peVar2);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_quiets);
        local_18[0] = ninf;
        ScoredMoves::create_chunk(peVar2,local_18);
        this->m_phase = this->m_phase + MateKiller1;
      }
    }
  }
  return;
}

Assistant:

void Moveorder::next_phase() {
		if ((m_phase == HashMove) ||
				(m_phase == MateKiller1) ||
				(m_phase == MateKiller2) ||
				(m_phase == Killer1) ||
				(m_phase == Killer2) ||
				(m_phase == InitCaptures) ||
				(m_phase == InitQuiets))
			m_phase = Phase(m_phase + 1);
		else if ((m_phase == GoodCaptures || m_phase == BadCaptures) && m_captures->end())
		{
			m_captures->create_chunk(Score::ninf); // mark bad captures
			m_phase = Phase(m_phase + 1);
		}
		else if ((m_phase == GoodQuiets || m_phase == BadQuiets) && m_quiets->end())
		{
			m_quiets->create_chunk(Score::ninf); // mark bad quiet moves
			m_phase = Phase(m_phase + 1);
		}
	}